

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_verify.c
# Opt level: O2

int main(int argc,char **argv)

{
  yajl_status yVar1;
  int iVar2;
  int extraout_EAX;
  yajl_handle hand;
  size_t sVar3;
  uchar *str;
  yajl_option opt;
  char *pcVar4;
  long lVar5;
  yajl_option yVar6;
  ulong uVar7;
  
  hand = yajl_alloc((yajl_callbacks *)0x0,(yajl_alloc_funcs *)0x0,(void *)0x0);
  yVar6 = 0;
  for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
    pcVar4 = argv[lVar5];
    if ((*pcVar4 != '-') || (sVar3 = strlen(pcVar4), sVar3 < 2)) {
LAB_00102425:
      usage(*argv);
      return extraout_EAX;
    }
    for (uVar7 = 1; sVar3 = strlen(pcVar4), uVar7 < sVar3; uVar7 = (ulong)((int)uVar7 + 1)) {
      opt = yajl_allow_comments;
      switch((int)pcVar4[uVar7] - 99U >> 1 | (uint)(((int)pcVar4[uVar7] - 99U & 1) != 0) << 0x1f) {
      case 0:
        break;
      default:
        fprintf(_stderr,"unrecognized option: \'%c\'\n\n");
        goto LAB_00102425;
      case 7:
        goto switchD_001022ca_caseD_7;
      case 8:
        opt = yajl_allow_multiple_values;
        break;
      case 9:
        opt = yajl_dont_validate_strings;
      }
      yajl_config(hand,opt,1);
      opt = yVar6;
switchD_001022ca_caseD_7:
      pcVar4 = argv[lVar5];
      yVar6 = opt;
    }
  }
  do {
    sVar3 = fread(main::fileData,1,0xffff,_stdin);
    if (sVar3 == 0) {
      iVar2 = feof(_stdin);
      if (iVar2 == 0) {
        iVar2 = 1;
        if (yVar6 == 0) {
          fwrite("error encountered on file read\n",0x1f,1,_stderr);
        }
        goto LAB_00102351;
      }
      break;
    }
    main::fileData[sVar3] = '\0';
    yVar1 = yajl_parse(hand,main::fileData,sVar3);
  } while (yVar1 == yajl_status_ok);
  iVar2 = 0;
LAB_00102351:
  yVar1 = yajl_complete_parse(hand);
  if (yVar1 != yajl_status_ok) {
    if (yVar6 == 0) {
      iVar2 = 1;
      str = yajl_get_error(hand,1,main::fileData,sVar3);
      fputs((char *)str,_stderr);
      yajl_free_error(hand,str);
    }
    else {
      iVar2 = 1;
    }
  }
  yajl_free(hand);
  if (yVar6 == 0) {
    pcVar4 = "invalid";
    if (iVar2 == 0) {
      pcVar4 = "valid";
    }
    printf("JSON is %s\n",pcVar4);
  }
  return iVar2;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_status stat;
    size_t rd;
    yajl_handle hand;
    static unsigned char fileData[65536];
    int quiet = 0;
    int retval = 0;
    int a = 1;

    /* allocate a parser */
    hand = yajl_alloc(NULL, NULL, NULL);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'q':
                    quiet = 1;
                    break;
                case 'c':
                    yajl_config(hand, yajl_allow_comments, 1);
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n", argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }

    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        retval = 0;

        if (rd == 0) {
            if (!feof(stdin)) {
                if (!quiet) {
                    fprintf(stderr, "error encountered on file read\n");
                }
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        /* read file data, pass to parser */
        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;
    }

    /* parse any remaining buffered data */
    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok)
    {
        if (!quiet) {
            unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
            fprintf(stderr, "%s", (const char *) str);
            yajl_free_error(hand, str);
        }
        retval = 1;
    }

    yajl_free(hand);

    if (!quiet) {
        printf("JSON is %s\n", retval ? "invalid" : "valid");
    }

    return retval;
}